

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::oneStepIntegration
          (ForwardEuler *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  element_type *peVar5;
  size_t sVar6;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *pMVar7;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffec8;
  VectorDynSize *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  StorageBaseType *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (bVar1) {
    sVar4 = iDynTree::VectorDynSize::size();
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a7084);
    sVar6 = DynamicalSystem::stateSpaceSize(peVar5);
    if (sVar4 == sVar6) {
      this_00 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                iDynTree::VectorDynSize::size();
      peVar5 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3a70f2);
      pMVar7 = (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               DynamicalSystem::stateSpaceSize(peVar5);
      if (this_00 != pMVar7) {
        peVar5 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3a7121);
        DynamicalSystem::stateSpaceSize(peVar5);
        iDynTree::VectorDynSize::resize((ulong)in_RDX);
        in_stack_fffffffffffffec8 = in_RDX;
      }
      peVar5 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3a7144);
      uVar2 = (*peVar5->_vptr_DynamicalSystem[2])(in_XMM0_Qa,peVar5,in_RSI,in_RDI + 0x58);
      if ((uVar2 & 1) == 0) {
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a7179);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  (pcVar3,"oneStepIntegration","Error while evaluating the autonomous dynamics.");
        local_1 = false;
      }
      else {
        toEigen(in_stack_fffffffffffffee8);
        toEigen(in_stack_fffffffffffffee8);
        Eigen::operator*(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>::
        operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        toEigen(in_stack_fffffffffffffee8);
        Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                  (this_00,in_stack_fffffffffffffec8);
        local_1 = true;
      }
    }
    else {
      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a70a7);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar3,"oneStepIntegration","Wrong initial state dimension.");
      local_1 = false;
    }
  }
  else {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3a7039);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"oneStepIntegration","First you have to specify a dynamical system");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ForwardEuler::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x)
            {
                if (!m_dynamicalSystem_ptr) {
                    reportError(m_info.name().c_str(), "oneStepIntegration", "First you have to specify a dynamical system");
                    return false;
                }

                if (x0.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Wrong initial state dimension.");
                    return false;
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    x.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!m_dynamicalSystem_ptr->dynamics(x0, t0, m_computationBuffer)){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Error while evaluating the autonomous dynamics.");
                    return false;
                }

                toEigen(x) = toEigen(x0) + dT * toEigen(m_computationBuffer);

                return true;
            }